

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont_p.h
# Opt level: O0

void __thiscall QRawFontPrivate::setFontEngine(QRawFontPrivate *this,QFontEngine *engine)

{
  bool bVar1;
  long in_RSI;
  long *in_RDI;
  
  if (*in_RDI != in_RSI) {
    if (((*in_RDI != 0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x792a64), !bVar1)) &&
       ((long *)*in_RDI != (long *)0x0)) {
      (**(code **)(*(long *)*in_RDI + 8))();
    }
    *in_RDI = in_RSI;
    if (*in_RDI != 0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x792aae);
    }
  }
  return;
}

Assistant:

inline void setFontEngine(QFontEngine *engine)
    {
#ifndef QT_NO_DEBUG
        Q_ASSERT(fontEngine == nullptr || thread == QThread::currentThread());
#endif
        if (fontEngine == engine)
            return;

        if (fontEngine != nullptr) {
            if (!fontEngine->ref.deref())
                delete fontEngine;
#ifndef QT_NO_DEBUG
            thread = nullptr;
#endif
        }

        fontEngine = engine;

        if (fontEngine != nullptr) {
            fontEngine->ref.ref();
#ifndef QT_NO_DEBUG
            thread = QThread::currentThread();
            Q_ASSERT(thread);
#endif
        }
    }